

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_error.hpp
# Opt level: O3

void __thiscall jsoncons::jsonpath::jsonpath_error::~jsonpath_error(jsonpath_error *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  pointer pcVar3;
  
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->super_system_error + *(long *)((long)pvVar2 + -0x18)) = vtt[1];
  pcVar3 = (this->what_)._M_dataplus._M_p;
  paVar1 = &(this->what_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::system_error::~system_error(&this->super_system_error);
  return;
}

Assistant:

~jsonpath_error() override = default;